

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O1

Iterator * __thiscall
ctemplate::TemplateDictionary::CreateTemplateIterator
          (TemplateDictionary *this,TemplateString *section_name)

{
  small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *c;
  pointer ppTVar1;
  pointer ppTVar2;
  TemplateId v;
  second_type pvVar3;
  TemplateDictionary *d;
  Iterator *unaff_R15;
  bool bVar4;
  
  bVar4 = false;
  do {
    c = this->include_dict_;
    if (c != (small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
              *)0x0) {
      v = TemplateString::GetGlobalId(section_name);
      pvVar3 = find_ptr2<ctemplate::small_map<std::map<unsigned_long,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,unsigned_long>
                         (c,v);
      if (pvVar3 != (second_type)0x0) {
        unaff_R15 = (Iterator *)operator_new(0x18);
        ppTVar1 = (pvVar3->
                  super__Vector_base<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        ppTVar2 = (pvVar3->
                  super__Vector_base<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        unaff_R15->_vptr_Iterator = (_func_int **)&PTR__Iterator_0014d5a8;
        unaff_R15[1]._vptr_Iterator = (_func_int **)ppTVar1;
        unaff_R15[2]._vptr_Iterator = (_func_int **)ppTVar2;
        break;
      }
    }
    this = this->parent_dict_;
    bVar4 = this == (TemplateDictionary *)0x0;
  } while (!bVar4);
  if (bVar4) {
    __assert_fail("\"Call IsHiddenTemplate before CreateTemplateIterator\" && 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                  ,0x3ec,
                  "virtual TemplateDictionaryInterface::Iterator *ctemplate::TemplateDictionary::CreateTemplateIterator(const TemplateString &) const"
                 );
  }
  return unaff_R15;
}

Assistant:

TemplateDictionaryInterface::Iterator*
TemplateDictionary::CreateTemplateIterator(
    const TemplateString& section_name) const {
  for (const TemplateDictionary* d = this; d; d = d->parent_dict_) {
    if (d->include_dict_) {
      if (DictVector* it = find_ptr2(*d->include_dict_, section_name.GetGlobalId())) {
        // Found it!  Return it as an Iterator
        return MakeIterator(*it);
      }
    }
  }
  assert("Call IsHiddenTemplate before CreateTemplateIterator" && 0);
  abort();
}